

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::ArrayPtr<const_char>_> * __thiscall
kj::_::NullableValue<kj::ArrayPtr<const_char>_>::operator=
          (NullableValue<kj::ArrayPtr<const_char>_> *this,
          NullableValue<kj::ArrayPtr<const_char>_> *other)

{
  size_t sVar1;
  
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
    }
    if (other->isSet == true) {
      sVar1 = (other->field_1).value.size_;
      (this->field_1).value.ptr = (other->field_1).value.ptr;
      (this->field_1).value.size_ = sVar1;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(const NullableValue& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, other.value);
        isSet = true;
      }
    }
    return *this;
  }